

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O1

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
CP::stack<int>::distribute
          (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *__return_storage_ptr__,stack<int> *this,size_t k)

{
  vector<int,std::allocator<int>> *this_00;
  iterator __position;
  ulong uVar1;
  int *__args;
  ulong uVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  allocator_type local_59;
  long local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__,k,&local_59);
  uVar1 = this->mSize;
  local_50 = uVar1 / k;
  local_48 = uVar1 % k;
  lVar3 = 0;
  local_38 = (ulong)((int)uVar1 - 1);
  local_58 = k + (k == 0);
  do {
    bVar6 = local_48 != 0;
    bVar5 = local_48 != 0;
    uVar1 = local_48 - 1;
    local_48 = 0;
    if (bVar5) {
      local_48 = uVar1;
    }
    uVar1 = bVar6 + local_50;
    local_40 = lVar3;
    if (uVar1 != 0) {
      lVar4 = (long)(int)local_38 << 2;
      uVar2 = 0;
      do {
        this_00 = (vector<int,std::allocator<int>> *)
                  ((__return_storage_ptr__->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar3);
        __args = (int *)((long)this->mData + lVar4);
        __position._M_current = *(int **)(this_00 + 8);
        if (__position._M_current == *(int **)(this_00 + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this_00,__position,__args);
        }
        else {
          *__position._M_current = *__args;
          *(int **)(this_00 + 8) = __position._M_current + 1;
        }
        uVar2 = uVar2 + 1;
        lVar4 = lVar4 + -4;
      } while (uVar2 < uVar1);
      local_38 = (ulong)(uint)((int)local_38 - (int)uVar2);
    }
    lVar3 = local_40 + 1;
  } while (lVar3 != local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<T>> CP::stack<T>::distribute(size_t k) const {
    std::vector<std::vector<T>> v(k);
    size_t least = mSize / k;
    size_t remain = mSize % k;
    int ind = mSize - 1;
    for (size_t i = 0; i < k; ++i) {
      size_t size = least; 
      if (remain > 0) {
        size++;
        remain--;
      }
      for (size_t j = 0; j < size; ++j) {
        v[i].push_back(*(mData+(ind--)));
      }
    }
    return v;
}